

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void compute_coherence_metrics<dense_parameters>(lda *l,dense_parameters *weights)

{
  pointer *ppfVar1;
  _Rb_tree_header *p_Var2;
  weight *pwVar3;
  iterator __position;
  pointer pfVar4;
  pointer pwVar5;
  iterator __position_00;
  lda *plVar6;
  uint32_t uVar7;
  unsigned_long uVar8;
  pointer pwVar9;
  long lVar10;
  pointer pvVar11;
  pointer pvVar12;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  _Var13;
  _Rb_tree_node_base *p_Var14;
  mapped_type *pmVar15;
  word_doc_frequency *wdf;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  ulong uVar18;
  pointer pvVar19;
  pointer pvVar20;
  pointer puVar21;
  feature_pair *pairs;
  long lVar22;
  vector<feature_pair,_std::allocator<feature_pair>_> *this;
  pointer pfVar23;
  long lVar24;
  ulong uVar25;
  _Rb_tree_header *p_Var26;
  long lVar27;
  ulong uVar28;
  lda *plVar29;
  float fVar30;
  float fVar31;
  initializer_list<word_doc_frequency> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> top_features_idx;
  anon_class_1_0_00000001 cmp;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> vec;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  coWordsDFSet;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  topics_word_pairs;
  ulong local_f0;
  pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_e8;
  allocator_type local_b9;
  lda *local_b8;
  pointer local_b0;
  long local_a8;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> local_a0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  local_88;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  local_58;
  long local_38;
  
  uVar18 = 1L << ((byte)l->all->num_bits & 0x3f);
  local_58.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::resize(&local_58,l->topics);
  local_b8 = l;
  if (l->topics != 0) {
    uVar28 = 10;
    if (uVar18 < 10) {
      uVar28 = uVar18;
    }
    local_38 = uVar28 + (uVar28 == 0);
    lVar27 = 0;
    local_f0 = 0;
    do {
      local_e8.first = 0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                        *)&local_88,(anon_class_1_0_00000001 *)&local_b0,
                       (vector<feature,_std::allocator<feature>_> *)&local_e8);
      if ((void *)local_e8.first != (void *)0x0) {
        operator_delete((void *)local_e8.first);
      }
      uVar7 = weights->_stride_shift;
      pwVar3 = weights->_begin;
      lVar22 = 0;
      lVar24 = local_38;
      local_a8 = lVar27;
      do {
        local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)(lVar22 >> 2);
        local_e8.first =
             CONCAT44(local_e8.first._4_4_,*(undefined4 *)((long)pwVar3 + lVar22 + lVar27));
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                *)&local_88,(value_type *)&local_e8);
        lVar10 = local_a8;
        lVar22 = lVar22 + (1L << ((byte)uVar7 & 0x3f)) * 4;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
      pwVar3 = weights->_begin;
      if (pwVar3 != pwVar3 + weights->_weight_mask + 1) {
        uVar7 = weights->_stride_shift;
        lVar27 = 0;
        do {
          fVar31 = *(float *)((long)pwVar3 + lVar27 + lVar10);
          if (*(float *)local_88._M_impl._0_8_ <= fVar31 &&
              fVar31 != *(float *)local_88._M_impl._0_8_) {
            std::
            priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
            ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                   *)&local_88);
            local_e8.second.
            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(lVar27 >> 2);
            local_e8.first =
                 CONCAT44(local_e8.first._4_4_,*(undefined4 *)((long)pwVar3 + lVar27 + lVar10));
            std::
            priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
            ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                    *)&local_88,(value_type *)&local_e8);
          }
          lVar27 = lVar27 + (1L << ((byte)uVar7 & 0x3f)) * 4;
        } while ((weight *)((long)pwVar3 + lVar27) != weights->_begin + weights->_weight_mask + 1);
      }
      local_e8.first = 0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
                 CONCAT44(local_88._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_88._M_impl.super__Rb_tree_header._M_header._M_color) -
                 local_88._M_impl._0_8_ >> 4);
      for (uVar18 = (ulong)(CONCAT44(local_88._M_impl.super__Rb_tree_header._M_header._4_4_,
                                     local_88._M_impl.super__Rb_tree_header._M_header._M_color) -
                           local_88._M_impl._0_8_) >> 4 & 0xffffffff; 0 < (int)uVar18;
          uVar18 = uVar18 - 1) {
        *(undefined8 *)(local_e8.first + uVar18 * 8 + -8) =
             *(undefined8 *)(local_88._M_impl._0_8_ + 8);
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
               *)&local_88);
      }
      if (local_e8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)local_e8.first) {
        this = local_58.
               super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_f0;
        uVar18 = 0;
        do {
          uVar25 = uVar18 + 1;
          uVar28 = uVar25;
          if (uVar25 < (ulong)((long)((long)local_e8.second.
                                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     local_e8.first) >> 3)) {
            do {
              local_a0.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((uint64_t *)local_e8.first)[uVar18];
              local_a0.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((uint64_t *)local_e8.first)[uVar28];
              __position._M_current =
                   (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<feature_pair,_std::allocator<feature_pair>_>::
                _M_realloc_insert<feature_pair>(this,__position,(feature_pair *)&local_a0);
              }
              else {
                local_a0.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                     (undefined4)
                     ((ulong)local_a0.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x20);
                local_a0.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                     (undefined4)
                     ((ulong)local_a0.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
                *(undefined4 *)&(__position._M_current)->f1 =
                     local_a0.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f1 + 4) =
                     local_a0.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_;
                *(undefined4 *)&(__position._M_current)->f2 =
                     local_a0.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f2 + 4) =
                     local_a0.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_4_;
                ppfVar1 = &(this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppfVar1 = *ppfVar1 + 1;
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 < (ulong)((long)((long)local_e8.second.
                                                                                                      
                                                  super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                            local_e8.first) >> 3));
          }
          uVar18 = uVar25;
        } while (uVar25 < (ulong)((long)((long)local_e8.second.
                                               super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                               ._M_impl.super__Vector_impl_data._M_start -
                                        local_e8.first) >> 3));
      }
      if ((pointer)local_e8.first != (pointer)0x0) {
        operator_delete((void *)local_e8.first);
      }
      lVar27 = local_a8;
      if ((float *)local_88._M_impl._0_8_ != (float *)0x0) {
        operator_delete((void *)local_88._M_impl._0_8_);
      }
      local_f0 = local_f0 + 1;
      lVar27 = lVar27 + 4;
    } while (local_f0 < local_b8->topics);
  }
  pvVar11 = local_58.
            super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var2 = &local_88._M_impl.super__Rb_tree_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar6 = local_b8;
  p_Var14 = &p_Var2->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_58.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar12 = local_58.
              super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pfVar4 = (pvVar12->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar23 = (pvVar12->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                     _M_impl.super__Vector_impl_data._M_start; pfVar23 != pfVar4;
          pfVar23 = pfVar23 + 1) {
        pwVar5 = (pointer)pfVar23->f1;
        local_b0 = (pointer)pfVar23->f2;
        p_Var16 = &p_Var2->_M_header;
        for (p_Var17 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var17 != (_Rb_tree_header *)0x0;
            p_Var17 = (&p_Var17->_M_left)[*(pointer *)(p_Var17 + 1) < pwVar5]) {
          if (*(pointer *)(p_Var17 + 1) >= pwVar5) {
            p_Var16 = p_Var17;
          }
        }
        p_Var26 = p_Var2;
        if (((_Rb_tree_header *)p_Var16 != p_Var2) &&
           (p_Var26 = (_Rb_tree_header *)p_Var16,
           pwVar5 < (pointer)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
          p_Var26 = p_Var2;
        }
        if (p_Var26 == p_Var2) {
          local_e8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)local_e8.second.
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_e8;
          local_e8.first = (unsigned_long)local_b0;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_a0,__l,&local_b9);
          local_e8.first = (unsigned_long)pwVar5;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_e8.second,&local_a0);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
                      *)&local_88,&local_e8);
          if (local_e8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.second.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a0.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          _Var13 = std::
                   __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<dense_parameters>(lda&,dense_parameters&)::_lambda(word_doc_frequency_const&)_1_>>
                             (*(undefined8 *)(p_Var26 + 1),*(undefined8 *)((long)(p_Var26 + 1) + 8),
                              &local_b0);
          pwVar5 = local_e8.second.
                   super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          __position_00._M_current = *(word_doc_frequency **)((long)(p_Var26 + 1) + 8);
          if (_Var13._M_current != __position_00._M_current) {
            local_e8.first = (unsigned_long)local_b0;
            uVar8 = local_e8.first;
            local_e8.second.
            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_e8.second.
                                  super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            pwVar9 = local_e8.second.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (__position_00._M_current == *(word_doc_frequency **)((long)(p_Var26 + 1) + 0x10)) {
              std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::
              _M_realloc_insert<word_doc_frequency>
                        ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                         (p_Var26 + 1),__position_00,(word_doc_frequency *)&local_e8);
            }
            else {
              local_e8.first._0_4_ = SUB84(local_b0,0);
              local_e8.first._4_4_ = (undefined4)((ulong)local_b0 >> 0x20);
              local_e8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = SUB84(pwVar5,4);
              *(undefined4 *)&(__position_00._M_current)->idx = (undefined4)local_e8.first;
              *(undefined4 *)((long)&(__position_00._M_current)->idx + 4) = local_e8.first._4_4_;
              (__position_00._M_current)->count = 0;
              *(undefined4 *)&(__position_00._M_current)->field_0xc =
                   local_e8.second.
                   super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_;
              *(long *)((long)(p_Var26 + 1) + 8) = *(long *)((long)(p_Var26 + 1) + 8) + 0x10;
              local_e8.first = uVar8;
              local_e8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start = pwVar9;
            }
          }
        }
      }
      pvVar12 = pvVar12 + 1;
      plVar6 = local_b8;
      p_Var14 = local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (pvVar12 != pvVar11);
  }
  do {
    plVar29 = local_b8;
    if ((_Rb_tree_header *)p_Var14 == p_Var2) {
      if (local_b8->topics == 0) {
        local_f0._0_4_ = 0.0;
        uVar18 = 0;
        local_b8 = plVar6;
      }
      else {
        local_f0._0_4_ = 0.0;
        uVar28 = 0;
        local_b8 = plVar6;
        do {
          pfVar23 = local_58.
                    super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar28].
                    super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pfVar4 = local_58.
                   super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar28].
                   super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          fVar31 = 0.0;
          if (pfVar23 != pfVar4) {
            fVar31 = 0.0;
            do {
              local_e8.first = pfVar23->f1;
              if ((plVar29->feature_counts).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_e8.first] != 0) {
                local_a0.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar23->f2;
                pmVar15 = std::
                          map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                          ::operator[]((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                                        *)&local_88,&local_e8.first);
                _Var13 = std::
                         __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<dense_parameters>(lda&,dense_parameters&)::_lambda(word_doc_frequency_const&)_2_>>
                                   ((pmVar15->
                                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                                    (pmVar15->
                                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                    )._M_impl.super__Vector_impl_data._M_finish,&local_a0);
                plVar29 = local_b8;
                if (_Var13._M_current !=
                    (pmVar15->
                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
                  fVar30 = logf(((float)(_Var13._M_current)->count + 1e-06) /
                                (float)(local_b8->feature_counts).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_e8.first]);
                  fVar31 = fVar31 + fVar30;
                }
              }
              pfVar23 = pfVar23 + 1;
            } while (pfVar23 != pfVar4);
          }
          printf("Topic %3d coherence: %f\n",SUB84((double)fVar31,0),uVar28 & 0xffffffff);
          local_f0._0_4_ = (float)local_f0 + fVar31;
          uVar28 = uVar28 + 1;
          uVar18 = plVar29->topics;
        } while (uVar28 < uVar18);
      }
      printf("Avg topic coherence: %f\n",SUB84((double)((float)local_f0 / (float)uVar18),0));
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
      ::~_Rb_tree(&local_88);
      std::
      vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ::~vector(&local_58);
      return;
    }
    p_Var17 = p_Var14[1]._M_parent;
    p_Var16 = p_Var14[1]._M_left;
    if (p_Var17 != p_Var16) {
      pvVar19 = (local_b8->feature_to_example_map).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var14 + 1);
      do {
        puVar21 = (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&(pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data + 8) != puVar21) {
          pvVar20 = (local_b8->feature_to_example_map).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var17;
          uVar18 = 0;
          uVar28 = 0;
          do {
            lVar27 = *(long *)&(pvVar20->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data;
            if ((ulong)((long)*(pointer *)
                               ((long)&(pvVar20->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data + 8) - lVar27 >> 3) <=
                uVar18) break;
            uVar25 = *(ulong *)(lVar27 + uVar18 * 8);
            if (puVar21[uVar28] == uVar25) {
              *(int *)&p_Var17->_M_parent = *(int *)&p_Var17->_M_parent + 1;
              uVar28 = uVar28 + 1;
LAB_001b990b:
              uVar18 = uVar18 + 1;
            }
            else {
              if (uVar25 < puVar21[uVar28]) goto LAB_001b990b;
              uVar28 = uVar28 + 1;
            }
            puVar21 = (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar28 < (ulong)((long)*(pointer *)
                                           ((long)&(pvVar19->
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                    (long)puVar21 >> 3));
        }
        p_Var17 = (_Base_ptr)&p_Var17->_M_left;
      } while (p_Var17 != p_Var16);
    }
    local_b8 = plVar6;
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    plVar6 = local_b8;
    local_b8 = plVar29;
  } while( true );
}

Assistant:

void compute_coherence_metrics(lda &l, T &weights)
{
  uint64_t length = (uint64_t)1 << l.all->num_bits;

  std::vector<std::vector<feature_pair>> topics_word_pairs;
  topics_word_pairs.resize(l.topics);

  int top_words_count = 10;  // parameterize and check

  for (size_t topic = 0; topic < l.topics; topic++)
  {
    // get top features for this topic
    auto cmp = [](feature &left, feature &right) { return left.x > right.x; };
    std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
    typename T::iterator iter = weights.begin();
    for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
      top_features.push(feature((&(*iter))[topic], iter.index()));

    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if ((&(*v))[topic] > top_features.top().x)
      {
        top_features.pop();
        top_features.push(feature((&(*v))[topic], v.index()));
      }

    // extract idx and sort descending
    vector<uint64_t> top_features_idx;
    top_features_idx.resize(top_features.size());
    for (int i = (int)top_features.size() - 1; i >= 0; i--)
    {
      top_features_idx[i] = top_features.top().weight_index;
      top_features.pop();
    }

    auto &word_pairs = topics_word_pairs[topic];
    for (size_t i = 0; i < top_features_idx.size(); i++)
      for (size_t j = i + 1; j < top_features_idx.size(); j++)
        word_pairs.push_back(feature_pair(top_features_idx[i], top_features_idx[j]));
  }

  // compress word pairs and create record for storing frequency
  std::map<uint64_t, std::vector<word_doc_frequency>> coWordsDFSet;
  for (auto &vec : topics_word_pairs)
  {
    for (auto &wp : vec)
    {
      auto f1 = wp.f1;
      auto f2 = wp.f2;
      auto wdf = coWordsDFSet.find(f1);

      if (wdf != coWordsDFSet.end())
      {
        // http://stackoverflow.com/questions/5377434/does-stdmapiterator-return-a-copy-of-value-or-a-value-itself
        // if (wdf->second.find(f2) == wdf->second.end())

        if (std::find_if(wdf->second.begin(), wdf->second.end(),
                [&f2](const word_doc_frequency &v) { return v.idx == f2; }) != wdf->second.end())
        {
          wdf->second.push_back({f2, 0});
          // printf(" add %d %d\n", f1, f2);
        }
      }
      else
      {
        std::vector<word_doc_frequency> vec = {{f2, 0}};
        coWordsDFSet.insert(std::make_pair(f1, vec));
        // printf(" insert %d %d\n", f1, f2);
      }
    }
  }

  // this.GetWordPairsDocumentFrequency(coWordsDFSet);
  for (auto &pair : coWordsDFSet)
  {
    auto &examples_for_f1 = l.feature_to_example_map[pair.first];
    for (auto &wdf : pair.second)
    {
      auto &examples_for_f2 = l.feature_to_example_map[wdf.idx];

      // assumes examples_for_f1 and examples_for_f2 are orderd
      size_t i = 0;
      size_t j = 0;
      while (i < examples_for_f1.size() && j < examples_for_f2.size())
      {
        if (examples_for_f1[i] == examples_for_f2[j])
        {
          wdf.count++;
          i++;
          j++;
        }
        else if (examples_for_f2[j] < examples_for_f1[i])
          j++;
        else
          i++;
      }
    }
  }

  float epsilon = 1e-6f;  // TODO
  float avg_coherence = 0;
  for (size_t topic = 0; topic < l.topics; topic++)
  {
    float coherence = 0;

    for (auto &pairs : topics_word_pairs[topic])
    {
      auto f1 = pairs.f1;
      if (l.feature_counts[f1] == 0)
        continue;

      auto f2 = pairs.f2;
      auto &co_feature = coWordsDFSet[f1];
      auto co_feature_df = std::find_if(
          co_feature.begin(), co_feature.end(), [&f2](const word_doc_frequency &v) { return v.idx == f2; });

      if (co_feature_df != co_feature.end())
      {
        // printf("(%d:%d + eps)/(%d:%d)\n", f2, co_feature_df->count, f1, l.feature_counts[f1]);
        coherence += logf((co_feature_df->count + epsilon) / l.feature_counts[f1]);
      }
    }

    printf("Topic %3d coherence: %f\n", (int)topic, coherence);

    // TODO: expose per topic coherence

    // TODO: good vs. bad topics
    avg_coherence += coherence;
  }

  avg_coherence /= l.topics;

  printf("Avg topic coherence: %f\n", avg_coherence);
}